

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O2

Hop_Obj_t * Kit_GraphToHopInternal(Hop_Man_t *pMan,Kit_Graph_t *pGraph)

{
  uint uVar1;
  uint uVar2;
  Kit_Node_t *pKVar3;
  Hop_Obj_t *pHVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *puVar7;
  anon_union_8_2_00c7e208_for_Kit_Node_t__2 *paVar8;
  
  if (pGraph->fConst == 0) {
    uVar6 = (ulong)(uint)pGraph->nLeaves;
    if (((uint)pGraph->eRoot >> 1 & 0x3fffffff) < (uint)pGraph->nLeaves) {
      pKVar3 = Kit_GraphVar(pGraph);
      paVar8 = &pKVar3->field_2;
    }
    else {
      lVar5 = uVar6 * 0x18;
      puVar7 = (undefined1 *)0x0;
      for (; (long)uVar6 < (long)pGraph->nSize; uVar6 = uVar6 + 1) {
        pKVar3 = pGraph->pNodes;
        puVar7 = &(pKVar3->eEdge0).field_0x0 + lVar5;
        uVar1 = *(uint *)(&(pKVar3->eEdge0).field_0x0 + lVar5);
        uVar2 = *(uint *)(&(pKVar3->eEdge1).field_0x0 + lVar5);
        pHVar4 = Hop_And(pMan,(Hop_Obj_t *)
                              ((ulong)(uVar1 & 1) ^
                              (ulong)pKVar3[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Hop_Obj_t *)
                         ((ulong)(uVar2 & 1) ^ (ulong)pKVar3[uVar2 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Hop_Obj_t **)((long)&pKVar3->field_2 + lVar5) = pHVar4;
        lVar5 = lVar5 + 0x18;
      }
      paVar8 = (anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)(puVar7 + 8);
    }
  }
  else {
    paVar8 = (anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)&pMan->pConst1;
  }
  return (Hop_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)paVar8->pFunc);
}

Assistant:

Hop_Obj_t * Kit_GraphToHopInternal( Hop_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    Hop_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Hop_NotCond( Hop_ManConst1(pMan), Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Hop_NotCond( (Hop_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Hop_NotCond( (Hop_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Hop_NotCond( (Hop_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Hop_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Hop_NotCond( (Hop_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}